

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_BinaryDilate(BinaryDilateForm1 BinaryDilate)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ImageTemplate<unsigned_char> *image1;
  code *in_RDI;
  uint32_t dilationY;
  uint32_t dilationX;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fillData;
  undefined4 in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  uint8_t value;
  uint in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 in_stack_ffffffffffffff56;
  byte bVar5;
  undefined1 in_stack_ffffffffffffff57;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 *__n;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 local_88 [64];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb8;
  undefined1 local_22;
  undefined1 local_21;
  code *local_8;
  
  local_8 = in_RDI;
  uVar2 = Test_Helper::randomValue<unsigned_int>
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  image1 = (ImageTemplate<unsigned_char> *)(ulong)uVar2;
  local_21 = 0xff;
  __n = &local_22;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1cd3af);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),(size_type)__n,
             (value_type_conflict *)image1,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1cd3dd);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,
                               CONCAT15(in_stack_ffffffffffffff55,
                                        CONCAT14(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                                                )))),
             (value_type_conflict *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  Unit_Test::randomImage(in_stack_ffffffffffffffb8);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,
                               CONCAT15(in_stack_ffffffffffffff55,
                                        CONCAT14(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                                                )))),
             (ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  uVar3 = Test_Helper::randomValue<unsigned_int>
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  uVar2 = uVar3;
  uVar4 = Test_Helper::randomValue<unsigned_int>
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  value = (uint8_t)(in_stack_ffffffffffffff4c >> 0x18);
  (*local_8)(local_88,uVar2,uVar4);
  bVar1 = Unit_Test::equalSize<PenguinV_Image::ImageTemplate<unsigned_char>>
                    (image1,(ImageTemplate<unsigned_char> *)CONCAT44(uVar3,uVar4));
  bVar5 = false;
  if (bVar1) {
    bVar5 = Unit_Test::verifyImage
                      ((Image *)CONCAT17(bVar1,(uint7)CONCAT15(in_stack_ffffffffffffff55,
                                                               CONCAT14(in_stack_ffffffffffffff54,
                                                                        in_stack_ffffffffffffff50)))
                       ,value);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cd4cb);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cd4d5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image1);
  return (bool)(bVar5 & 1);
}

Assistant:

bool form1_BinaryDilate(BinaryDilateForm1 BinaryDilate)
    {
        std::vector< uint8_t > fillData( randomValue<uint32_t>(20, 200), 255u );
        fillData.push_back(0u);

        const PenguinV_Image::Image input = randomImage( fillData );
        PenguinV_Image::Image output = input;

        const uint32_t dilationX = randomValue<uint32_t>(1, 5);
        const uint32_t dilationY = randomValue<uint32_t>(1, 5);

        BinaryDilate(output, dilationX, dilationY);

        return equalSize( input, output ) && verifyImage( output, 255u );
    }